

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cpp
# Opt level: O1

NULLCArray NULLCMemory::read_double_array(NULLCArray buffer,int offset,int elements)

{
  bool bVar1;
  int in_R9D;
  NULLCArray NVar2;
  
  NVar2.ptr._4_4_ = (undefined4)((ulong)register0x00000030 >> 0x20);
  NVar2.ptr._0_4_ = buffer.len;
  NVar2.len = offset;
  bVar1 = check_access((NULLCMemory *)buffer.ptr,NVar2,3,elements,in_R9D);
  if (bVar1) {
    NVar2 = nullcAllocateArrayTyped(7,elements);
    memcpy(NVar2.ptr,(NULLCMemory *)buffer.ptr + offset,(long)elements << 3);
  }
  else {
    NVar2 = (NULLCArray)ZEXT812(0);
  }
  return NVar2;
}

Assistant:

NULLCArray read_double_array(NULLCArray buffer, int offset, int elements)
	{
		NULLCArray result = { 0, 0 };

		if(!check_access(buffer, offset, 3, elements))
			return result;

		result = nullcAllocateArrayTyped(NULLC_TYPE_DOUBLE, elements);

		memcpy(result.ptr, buffer.ptr + offset, sizeof(double) * elements);
		return result;
	}